

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::reportIfCannotBeNull
          (CheckerVisitor *this,Expr *checkee,Expr *n,char *loc)

{
  bool bVar1;
  TreeOp TVar2;
  Expr *pEVar3;
  undefined8 in_RCX;
  Node *in_RDX;
  void *extraout_RDX;
  TerExpr *in_RSI;
  CheckerVisitor *in_RDI;
  Expr *ifFalse;
  Expr *ifTrue;
  TerExpr *ter;
  Expr *in_stack_ffffffffffffffb8;
  TerExpr *local_10;
  
  TVar2 = Node::op((Node *)in_RSI);
  local_10 = in_RSI;
  if (TVar2 == TO_NULLC) {
    BinExpr::rhs((BinExpr *)in_RSI);
    local_10 = (TerExpr *)maybeEval(in_RDI,in_stack_ffffffffffffffb8,false);
  }
  TVar2 = Node::op((Node *)local_10);
  if (TVar2 == TO_TERNARY) {
    pEVar3 = TerExpr::b(local_10);
    maybeEval(in_RDI,in_stack_ffffffffffffffb8,false);
    TerExpr::c(local_10,pEVar3,extraout_RDX);
    maybeEval(in_RDI,in_stack_ffffffffffffffb8,false);
    bVar1 = cannotBeNull(in_stack_ffffffffffffffb8);
    if ((bVar1) && (bVar1 = cannotBeNull(in_stack_ffffffffffffffb8), bVar1)) {
      report(in_RDI,in_RDX,0x7a,in_RCX);
    }
  }
  else {
    bVar1 = cannotBeNull(in_stack_ffffffffffffffb8);
    if (bVar1) {
      report(in_RDI,in_RDX,0x7a,in_RCX);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::reportIfCannotBeNull(const Expr *checkee, const Expr *n, const char *loc) {
  assert(n);

  if (checkee->op() == TO_NULLC) {
    checkee = maybeEval(static_cast<const BinExpr *>(checkee)->rhs());
  }

  if (checkee->op() == TO_TERNARY) {
    const TerExpr *ter = static_cast<const TerExpr *>(checkee);
    const Expr *ifTrue = maybeEval(ter->b());
    const Expr *ifFalse = maybeEval(ter->c());

    if (cannotBeNull(ifTrue) && cannotBeNull(ifFalse)) {
      report(n, DiagnosticsId::DI_EXPR_NOT_NULL, loc);
    }
    return;
  }

  if (cannotBeNull(checkee))
    report(n, DiagnosticsId::DI_EXPR_NOT_NULL, loc);
}